

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> __thiscall
wasm::MultiMemoryLowering::memoryGrow(MultiMemoryLowering *this,Index memIdx,Name memoryName)

{
  Name root;
  string_view name_00;
  bool bVar1;
  Index IVar2;
  BinaryOp BVar3;
  BinaryOp op;
  pointer pFVar4;
  reference pvVar5;
  Call *value;
  LocalSet *pLVar6;
  MemorySize *value_00;
  LocalGet *pLVar7;
  MemoryGrow *left;
  Const *pCVar8;
  Binary *pBVar9;
  Return *ifTrue;
  If *append;
  GlobalGet *pGVar10;
  Binary *pBVar11;
  GlobalGet *right;
  MemoryCopy *append_00;
  size_type sVar12;
  string_view *psVar13;
  GlobalSet *append_01;
  Block *pBVar14;
  undefined4 in_register_00000034;
  MultiMemoryLowering *this_00;
  Type TVar15;
  Name NVar16;
  Name name_01;
  Name name_02;
  optional<wasm::Type> type;
  Name name_03;
  value_type *offsetGlobalName_1;
  Index i;
  Name offsetGlobalName;
  undefined1 local_218 [12];
  size_t local_208;
  char *pcStack_200;
  uintptr_t local_1f0;
  size_t local_1e8;
  char *pcStack_1e0;
  char *local_1d8;
  Name local_1d0;
  uintptr_t local_1c0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_1b8;
  size_t local_198;
  char *pcStack_190;
  char *local_180;
  Name local_178;
  Index local_168;
  Index local_164;
  Index returnLocal;
  Index sizeLocal;
  Expression *functionBody;
  anon_class_16_2_29deed5a getMoveSource;
  anon_class_24_3_04b167d9 getOffsetDelta;
  anon_class_8_1_911e227b pageSizeConst;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_118;
  uintptr_t local_100;
  uintptr_t local_f8;
  Signature local_f0;
  HeapType local_e0;
  char *local_d8;
  HeapType HStack_d0;
  undefined1 local_b9;
  size_t local_b8;
  size_t sStack_b0;
  undefined1 auStack_a8 [8];
  Name functionName;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 auStack_48 [8];
  Name name;
  Builder builder;
  Index memIdx_local;
  MultiMemoryLowering *this_local;
  Name memoryName_local;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *function;
  
  this_00 = (MultiMemoryLowering *)CONCAT44(in_register_00000034,memIdx);
  this_local = memoryName.super_IString.str._M_str;
  offsetGlobalName_1._4_4_ = (uint)memoryName.super_IString.str._M_len;
  memoryName_local.super_IString.str._M_str = (char *)this;
  Builder::Builder((Builder *)&name.super_IString.str._M_str,this_00->wasm);
  IString::toString_abi_cxx11_(&local_88,(IString *)&this_local);
  std::operator+(&local_68,&local_88,"_grow");
  wasm::Name::Name((Name *)auStack_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  local_b8 = (size_t)auStack_48;
  sStack_b0 = name.super_IString.str._M_len;
  root.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
  root.super_IString.str._M_len = (size_t)auStack_48;
  _auStack_a8 = (string_view)Names::getValidFunctionName(this_00->wasm,root);
  local_b9 = 0;
  local_d8 = (char *)auStack_a8;
  HStack_d0.id = functionName.super_IString.str._M_len;
  local_f8 = (this_00->pointerType).id;
  local_100 = (this_00->pointerType).id;
  Signature::Signature(&local_f0,(Type)local_f8,(Type)local_100);
  HeapType::HeapType(&local_e0,local_f0);
  local_118.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar15.id = (uintptr_t)&local_118;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)TVar15.id);
  name_03.super_IString.str._M_str = local_d8;
  name_03.super_IString.str._M_len = (size_t)this;
  Builder::makeFunction
            (name_03,HStack_d0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e0.id,
             (Expression *)TVar15.id);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_118);
  pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)this);
  wasm::Name::Name((Name *)&pageSizeConst,"page_delta");
  Function::setLocalName(pFVar4,0,(Name)_pageSizeConst);
  functionBody = (Expression *)&name.super_IString.str._M_str;
  getOffsetDelta.this = (MultiMemoryLowering *)&getOffsetDelta.pageSizeConst;
  local_164 = 0xffffffff;
  getMoveSource.builder = (Builder *)this_00;
  getMoveSource.this = (MultiMemoryLowering *)functionBody;
  getOffsetDelta.builder = (Builder *)this_00;
  getOffsetDelta.pageSizeConst = (anon_class_8_1_911e227b *)functionBody;
  pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)this);
  wasm::Name::Name(&local_178,"return_size");
  local_180 = (char *)(this_00->pointerType).id;
  name_01.super_IString.str._M_str = local_180;
  name_01.super_IString.str._M_len = (size_t)local_178.super_IString.str._M_str;
  IVar2 = Builder::addVar((Builder *)pFVar4,(Function *)local_178.super_IString.str._M_len,name_01,
                          TVar15);
  local_168 = IVar2;
  pvVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                     (&this_00->memorySizeNames,(ulong)offsetGlobalName_1._4_4_);
  local_198 = (pvVar5->super_IString).str._M_len;
  pcStack_190 = (pvVar5->super_IString).str._M_str;
  local_1b8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_1b8);
  TVar15.id = (this_00->pointerType).id;
  NVar16.super_IString.str._M_str = pcStack_190;
  NVar16.super_IString.str._M_len = local_198;
  local_1c0 = TVar15.id;
  value = Builder::makeCall((Builder *)&name.super_IString.str._M_str,NVar16,&local_1b8,TVar15,false
                           );
  pLVar6 = Builder::makeLocalSet
                     ((Builder *)&name.super_IString.str._M_str,IVar2,(Expression *)value);
  _returnLocal = Builder::blockify((Builder *)&name.super_IString.str._M_str,(Expression *)pLVar6,
                                   (Expression *)0x0);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_1b8);
  bVar1 = isLastMemory(this_00,offsetGlobalName_1._4_4_);
  if (!bVar1) {
    pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)this);
    wasm::Name::Name(&local_1d0,"memory_size");
    local_1d8 = (char *)(this_00->pointerType).id;
    name_02.super_IString.str._M_str = local_1d8;
    name_02.super_IString.str._M_len = (size_t)local_1d0.super_IString.str._M_str;
    IVar2 = Builder::addVar((Builder *)pFVar4,(Function *)local_1d0.super_IString.str._M_len,name_02
                            ,TVar15);
    pBVar14 = _returnLocal;
    local_1e8 = (this_00->combinedMemory).super_IString.str._M_len;
    pcStack_1e0 = (this_00->combinedMemory).super_IString.str._M_str;
    local_164 = IVar2;
    value_00 = Builder::makeMemorySize
                         ((Builder *)&name.super_IString.str._M_str,
                          (Name)(this_00->combinedMemory).super_IString.str,this_00->memoryInfo);
    pLVar6 = Builder::makeLocalSet
                       ((Builder *)&name.super_IString.str._M_str,IVar2,(Expression *)value_00);
    _returnLocal = Builder::blockify((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar14
                                     ,(Expression *)pLVar6);
  }
  pBVar14 = _returnLocal;
  local_1f0 = (this_00->pointerType).id;
  pLVar7 = Builder::makeLocalGet((Builder *)&name.super_IString.str._M_str,0,(Type)local_1f0);
  local_208 = (this_00->combinedMemory).super_IString.str._M_len;
  pcStack_200 = (this_00->combinedMemory).super_IString.str._M_str;
  left = Builder::makeMemoryGrow
                   ((Builder *)&name.super_IString.str._M_str,(Expression *)pLVar7,
                    (Name)(this_00->combinedMemory).super_IString.str,this_00->memoryInfo);
  pCVar8 = Builder::makeConst<int>((Builder *)&name.super_IString.str._M_str,-1);
  pBVar9 = Builder::makeBinary((Builder *)&name.super_IString.str._M_str,EqInt32,(Expression *)left,
                               (Expression *)pCVar8);
  pCVar8 = Builder::makeConst<int>((Builder *)&name.super_IString.str._M_str,-1);
  ifTrue = Builder::makeReturn((Builder *)&name.super_IString.str._M_str,(Expression *)pCVar8);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_218);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_218._0_8_;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_218[8];
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_218._9_3_;
  append = Builder::makeIf((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar9,
                           (Expression *)ifTrue,(Expression *)0x0,type);
  _returnLocal = Builder::blockify((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar14,
                                   (Expression *)append);
  bVar1 = isLastMemory(this_00,offsetGlobalName_1._4_4_);
  if (!bVar1) {
    NVar16 = getOffsetGlobal(this_00,offsetGlobalName_1._4_4_ + 1);
    pBVar14 = _returnLocal;
    BVar3 = Abstract::getBinary((Type)(this_00->pointerType).id,Add);
    pGVar10 = memoryGrow::anon_class_16_2_29deed5a::operator()
                        ((anon_class_16_2_29deed5a *)&functionBody,NVar16);
    pBVar9 = memoryGrow::anon_class_24_3_04b167d9::operator()
                       ((anon_class_24_3_04b167d9 *)&getMoveSource.this);
    pBVar9 = Builder::makeBinary((Builder *)&name.super_IString.str._M_str,BVar3,
                                 (Expression *)pGVar10,(Expression *)pBVar9);
    pGVar10 = memoryGrow::anon_class_16_2_29deed5a::operator()
                        ((anon_class_16_2_29deed5a *)&functionBody,NVar16);
    BVar3 = Abstract::getBinary((Type)(this_00->pointerType).id,Sub);
    op = Abstract::getBinary((Type)(this_00->pointerType).id,Mul);
    pLVar7 = Builder::makeLocalGet
                       ((Builder *)&name.super_IString.str._M_str,local_164,
                        (Type)(this_00->pointerType).id);
    pCVar8 = memoryGrow::anon_class_8_1_911e227b::operator()
                       ((anon_class_8_1_911e227b *)&getOffsetDelta.pageSizeConst);
    pBVar11 = Builder::makeBinary((Builder *)&name.super_IString.str._M_str,op,(Expression *)pLVar7,
                                  (Expression *)pCVar8);
    right = memoryGrow::anon_class_16_2_29deed5a::operator()
                      ((anon_class_16_2_29deed5a *)&functionBody,NVar16);
    pBVar11 = Builder::makeBinary((Builder *)&name.super_IString.str._M_str,BVar3,
                                  (Expression *)pBVar11,(Expression *)right);
    append_00 = Builder::makeMemoryCopy
                          ((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar9,
                           (Expression *)pGVar10,(Expression *)pBVar11,
                           (Name)(this_00->combinedMemory).super_IString.str,
                           (Name)(this_00->combinedMemory).super_IString.str);
    _returnLocal = Builder::blockify((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar14
                                     ,(Expression *)append_00);
  }
  for (; sVar12 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                            (&this_00->offsetGlobalNames), pBVar14 = _returnLocal,
      offsetGlobalName_1._4_4_ < sVar12; offsetGlobalName_1._4_4_ = offsetGlobalName_1._4_4_ + 1) {
    psVar13 = (string_view *)
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                        (&this_00->offsetGlobalNames,(ulong)offsetGlobalName_1._4_4_);
    pBVar14 = _returnLocal;
    name_00 = *psVar13;
    BVar3 = Abstract::getBinary((Type)(this_00->pointerType).id,Add);
    pGVar10 = memoryGrow::anon_class_16_2_29deed5a::operator()
                        ((anon_class_16_2_29deed5a *)&functionBody,(Name)*psVar13);
    pBVar9 = memoryGrow::anon_class_24_3_04b167d9::operator()
                       ((anon_class_24_3_04b167d9 *)&getMoveSource.this);
    pBVar9 = Builder::makeBinary((Builder *)&name.super_IString.str._M_str,BVar3,
                                 (Expression *)pGVar10,(Expression *)pBVar9);
    append_01 = Builder::makeGlobalSet
                          ((Builder *)&name.super_IString.str._M_str,(Name)name_00,
                           (Expression *)pBVar9);
    _returnLocal = Builder::blockify((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar14
                                     ,(Expression *)append_01);
  }
  pLVar7 = Builder::makeLocalGet
                     ((Builder *)&name.super_IString.str._M_str,local_168,
                      (Type)(this_00->pointerType).id);
  pBVar14 = Builder::blockify((Builder *)&name.super_IString.str._M_str,(Expression *)pBVar14,
                              (Expression *)pLVar7);
  _returnLocal = pBVar14;
  pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)this);
  pFVar4->body = (Expression *)pBVar14;
  return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Function> memoryGrow(Index memIdx, Name memoryName) {
    Builder builder(*wasm);
    Name name = memoryName.toString() + "_grow";
    Name functionName = Names::getValidFunctionName(*wasm, name);
    auto function = Builder::makeFunction(
      functionName, Signature(pointerType, pointerType), {});
    function->setLocalName(0, "page_delta");
    auto pageSizeConst = [&]() {
      return builder.makeConst(Literal(Memory::kPageSize));
    };
    auto getOffsetDelta = [&]() {
      return builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                                builder.makeLocalGet(0, pointerType),
                                pageSizeConst());
    };
    auto getMoveSource = [&](Name global) {
      return builder.makeGlobalGet(global, pointerType);
    };
    Expression* functionBody;
    Index sizeLocal = -1;

    Index returnLocal =
      Builder::addVar(function.get(), "return_size", pointerType);
    functionBody = builder.blockify(builder.makeLocalSet(
      returnLocal, builder.makeCall(memorySizeNames[memIdx], {}, pointerType)));

    if (!isLastMemory(memIdx)) {
      sizeLocal = Builder::addVar(function.get(), "memory_size", pointerType);
      functionBody = builder.blockify(
        functionBody,
        builder.makeLocalSet(
          sizeLocal, builder.makeMemorySize(combinedMemory, memoryInfo)));
    }

    // Attempt to grow the combinedMemory. If -1 returns, enough memory could
    // not be allocated, so return -1.
    functionBody = builder.blockify(
      functionBody,
      builder.makeIf(
        builder.makeBinary(
          EqInt32,
          builder.makeMemoryGrow(
            builder.makeLocalGet(0, pointerType), combinedMemory, memoryInfo),
          builder.makeConst(-1)),
        builder.makeReturn(builder.makeConst(-1))));

    // If we are not growing the last memory, then we need to copy data,
    // shifting it over to accomodate the increase from page_delta
    if (!isLastMemory(memIdx)) {
      // This offset is the starting pt for copying
      auto offsetGlobalName = getOffsetGlobal(memIdx + 1);
      functionBody = builder.blockify(
        functionBody,
        builder.makeMemoryCopy(
          // destination
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta()),
          // source
          getMoveSource(offsetGlobalName),
          // size
          builder.makeBinary(
            Abstract::getBinary(pointerType, Abstract::Sub),
            builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                               builder.makeLocalGet(sizeLocal, pointerType),
                               pageSizeConst()),
            getMoveSource(offsetGlobalName)),
          combinedMemory,
          combinedMemory));
    }

    // Adjust the offsets of the globals impacted by the memory.grow call
    for (Index i = memIdx; i < offsetGlobalNames.size(); i++) {
      auto& offsetGlobalName = offsetGlobalNames[i];
      functionBody = builder.blockify(
        functionBody,
        builder.makeGlobalSet(
          offsetGlobalName,
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta())));
    }

    functionBody = builder.blockify(
      functionBody, builder.makeLocalGet(returnLocal, pointerType));

    function->body = functionBody;
    return function;
  }